

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstr.cpp
# Opt level: O0

void __thiscall NaCSTRFunc::Function(NaCSTRFunc *this,NaReal *x,NaReal *y)

{
  double dVar1;
  long *plVar2;
  long *in_RDX;
  double *in_RSI;
  long *in_RDI;
  double dVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  NaReal Q;
  NaReal k2;
  NaReal k1;
  NaReal q_c;
  NaReal time;
  NaReal dt;
  
  if ((in_RSI != (double *)0x0) && (in_RDX != (long *)0x0)) {
    plVar2 = (long *)(**(code **)(*in_RDI + 0x18))();
    dVar3 = (double)(**(code **)(*plVar2 + 8))();
    plVar2 = (long *)(**(code **)(*in_RDI + 0x18))();
    uVar4 = (**(code **)(*plVar2 + 0x20))();
    memcpy(in_RDI + 9,in_RDI + 4,0x28);
    dVar1 = *in_RSI;
    dVar6 = (double)in_RDI[0x1e];
    dVar5 = exp(-(double)in_RDI[0x2d] / (double)in_RDI[0xc]);
    dVar6 = dVar6 * dVar5;
    dVar5 = (double)in_RDI[0x1f];
    dVar7 = exp(-(double)in_RDI[0x2e] / (double)in_RDI[0xc]);
    dVar5 = dVar5 * dVar7;
    in_RDI[4] = (long)(dVar3 * (-(dVar6 + dVar5) * (double)in_RDI[9] +
                               (((double)in_RDI[0x22] - (double)in_RDI[9]) * (double)in_RDI[0x15]) /
                               (double)in_RDI[0x16]) + (double)in_RDI[4]);
    in_RDI[5] = (long)(dVar3 * (dVar6 * (double)in_RDI[9] +
                               (((double)in_RDI[0x23] - (double)in_RDI[10]) * (double)in_RDI[0x15])
                               / (double)in_RDI[0x16]) + (double)in_RDI[5]);
    in_RDI[6] = (long)(dVar3 * (dVar5 * (double)in_RDI[9] +
                               (((double)in_RDI[0x24] - (double)in_RDI[0xb]) * (double)in_RDI[0x15])
                               / (double)in_RDI[0x16]) + (double)in_RDI[6]);
    in_RDI[7] = (long)(dVar3 * ((((double)in_RDI[0x25] - (double)in_RDI[0xc]) * (double)in_RDI[0x15]
                                ) / (double)in_RDI[0x16] +
                               (-((double)in_RDI[0x1c] * (double)in_RDI[0x1d]) *
                                ((double)in_RDI[0xc] - (double)in_RDI[0xd]) +
                               (double)in_RDI[9] * (double)in_RDI[0x16] *
                               (dVar6 * -(double)in_RDI[0x20] + dVar5 * -(double)in_RDI[0x21])) /
                               ((double)in_RDI[0x16] * (double)in_RDI[0x18] * (double)in_RDI[0x1a]))
                      + (double)in_RDI[7]);
    in_RDI[8] = (long)(dVar3 * ((((double)in_RDI[0x26] - (double)in_RDI[0xd]) * dVar1) /
                                (double)in_RDI[0x17] +
                               ((double)in_RDI[0x1c] * (double)in_RDI[0x1d] *
                               ((double)in_RDI[0xc] - (double)in_RDI[0xd])) /
                               ((double)in_RDI[0x17] * (double)in_RDI[0x19] * (double)in_RDI[0x1b]))
                      + (double)in_RDI[8]);
    if (in_RDI[0x14] != 0) {
      (**(code **)(*(long *)in_RDI[0x14] + 0x30))();
      (**(code **)(*(long *)in_RDI[0x14] + 0x10))(uVar4,(long *)in_RDI[0x14],0);
      (**(code **)(*(long *)in_RDI[0x14] + 0x10))(in_RDI[4],(long *)in_RDI[0x14],1);
      (**(code **)(*(long *)in_RDI[0x14] + 0x10))(in_RDI[5],(long *)in_RDI[0x14],2);
      (**(code **)(*(long *)in_RDI[0x14] + 0x10))(in_RDI[6],(long *)in_RDI[0x14],3);
      (**(code **)(*(long *)in_RDI[0x14] + 0x10))(in_RDI[7],(long *)in_RDI[0x14],4);
      (**(code **)(*(long *)in_RDI[0x14] + 0x10))(in_RDI[8],(long *)in_RDI[0x14],5);
      (**(code **)(*(long *)in_RDI[0x14] + 0x10))(dVar1,(long *)in_RDI[0x14],6);
    }
    *in_RDX = in_RDI[7];
  }
  return;
}

Assistant:

void
NaCSTRFunc::Function (NaReal* x, NaReal* y)
{
    if(NULL == x || NULL == y)
	return;

    NaReal dt = Timer().GetSamplingRate();	// seconds
    NaReal time = Timer().CurrentTime();	// seconds

    prev = cur;

    NaReal	q_c = *x;
    NaReal k1 = k10*exp(-E1R/prev.var.T);
    NaReal k2 = k20*exp(-E2R/prev.var.T);
    NaReal Q = prev.var.c_A*V*(k1*(-drH_1) + k2*(-drH_2));

    cur.var.c_A += dt*((c_Av - prev.var.c_A)*q/V - (k1+k2)*prev.var.c_A);
    cur.var.c_B += dt*((c_Bv - prev.var.c_B)*q/V + k1*prev.var.c_A);
    cur.var.c_C += dt*((c_Cv - prev.var.c_C)*q/V + k2*prev.var.c_A);
    cur.var.T += dt*((T_v - prev.var.T)*q/V
		     + (Q - A*k*(prev.var.T-prev.var.T_c))/(V*rho*Cp));
    cur.var.T_c += dt*((T_vc - prev.var.T_c)*q_c/V_c
		       + A*k*(prev.var.T-prev.var.T_c)/(V_c*rho_c*Cp_c));

    if(NULL != out) {
	out->AppendRecord();
	out->SetValue(time, 0);
	out->SetValue(cur.var.c_A, 1);
	out->SetValue(cur.var.c_B, 2);
	out->SetValue(cur.var.c_C, 3);
	out->SetValue(cur.var.T, 4);
	out->SetValue(cur.var.T_c, 5);
	out->SetValue(q_c, 6);
    }

    *y = cur.var.T;
}